

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlocaltime.cpp
# Opt level: O2

QString * __thiscall
QLocalTime::localTimeAbbbreviationAt
          (QString *__return_storage_ptr__,QLocalTime *this,qint64 local,TransitionOptions resolve)

{
  undefined4 in_register_0000000c;
  storage_type *psVar1;
  long in_FS_OFFSET;
  QByteArrayView ba;
  R_conflict15 RVar2;
  MkTimeResult use;
  QByteArrayView local_78;
  undefined1 *local_68;
  undefined1 *puStack_60;
  undefined1 *local_58;
  undefined1 *puStack_50;
  undefined1 *local_48;
  undefined1 *puStack_40;
  char *local_38;
  undefined1 *puStack_30;
  undefined1 *local_28;
  long local_20;
  
  psVar1 = (storage_type *)
           CONCAT44(in_register_0000000c,
                    resolve.super_QFlagsStorageHelper<QDateTimePrivate::TransitionOption,_4>.
                    super_QFlagsStorage<QDateTimePrivate::TransitionOption>.i);
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_28 = &DAT_aaaaaaaaaaaaaaaa;
  local_38 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_30 = &DAT_aaaaaaaaaaaaaaaa;
  local_48 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
  local_58 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_50 = &DAT_aaaaaaaaaaaaaaaa;
  local_68 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_60 = &DAT_aaaaaaaaaaaaaaaa;
  RVar2 = QRoundingDown::qDivMod<1000U,_long_long,_true>((longlong)this);
  anon_unknown.dwarf_d06ba1::resolveLocalTime
            ((MkTimeResult *)&local_68,RVar2.quotient,
             (QFlagsStorageHelper<QDateTimePrivate::TransitionOption,_4>)SUB84(local,0));
  if (local_28._0_1_ == false) {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
      (__return_storage_ptr__->d).d = (Data *)0x0;
      (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
      (__return_storage_ptr__->d).size = 0;
      return __return_storage_ptr__;
    }
  }
  else if (local_38 == (char *)0x0) {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
      qTzName(__return_storage_ptr__,(uint)(0 < (int)local_48));
      return __return_storage_ptr__;
    }
  }
  else {
    QByteArrayView::QByteArrayView<const_char_*,_true>(&local_78,&local_38);
    ba.m_data = psVar1;
    ba.m_size = (qsizetype)local_78.m_data;
    QString::fromLocal8Bit(__return_storage_ptr__,(QString *)local_78.m_size,ba);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
      return __return_storage_ptr__;
    }
  }
  __stack_chk_fail();
}

Assistant:

QString localTimeAbbbreviationAt(qint64 local, QDateTimePrivate::TransitionOptions resolve)
{
    auto use = resolveLocalTime(QRoundingDown::qDiv<MSECS_PER_SEC>(local), resolve);
    if (!use.good)
        return {};
#ifdef HAVE_TM_ZONE
    if (use.local.tm_zone)
        return QString::fromLocal8Bit(use.local.tm_zone);
#endif
    return qTzName(use.local.tm_isdst > 0 ? 1 : 0);
}